

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

void __thiscall c4::yml::Tree::merge_with(Tree *this,Tree *src,size_t src_node,size_t dst_node)

{
  ulong uVar1;
  NodeData *pNVar2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  Location LVar6;
  Location LVar7;
  Location LVar8;
  bool bVar9;
  size_t sVar10;
  csubstr *pcVar11;
  size_t ichild;
  size_t sVar12;
  long lVar13;
  char *extraout_RDX;
  Tree *pTVar14;
  char *pcVar15;
  undefined8 *puVar16;
  NodeType_e in_R8;
  byte bVar17;
  char msg [31];
  char acStack_1f0 [72];
  undefined8 uStack_1a8;
  undefined8 uStack_1a0;
  undefined8 uStack_198;
  char *pcStack_190;
  undefined8 uStack_188;
  undefined8 uStack_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  char *pcStack_168;
  undefined8 uStack_160;
  Tree *pTStack_158;
  ulong uStack_150;
  long lStack_148;
  Tree *pTStack_140;
  Tree *pTStack_138;
  NodeData *local_f8;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  size_t local_d8;
  undefined1 local_a0;
  size_t local_90;
  Tree *local_88;
  size_t local_80;
  size_t sStack_78;
  char *local_70;
  char *pcStack_68;
  char *local_60;
  size_t local_58;
  size_t sStack_50;
  char *local_48;
  char *pcStack_40;
  char *local_38;
  
  bVar17 = 0;
  sVar10 = dst_node;
  pTVar14 = src;
  pcVar15 = (char *)this;
  if (src == (Tree *)0x0) {
    uStack_e8 = 0x21206372;
    uStack_e4 = 0x756e203d;
    uStack_e0 = 0x74706c6c;
    uStack_dc = CONCAT13(uStack_dc._3_1_,0x2972);
    local_f8 = (NodeData *)0x6166206b63656863;
    uStack_f0 = 0x64656c69;
    uStack_ec = 0x7328203a;
    if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_58 = 0;
    sStack_50 = 0x662e;
    local_48 = (char *)0x0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = (char *)0x65;
    sVar10 = 0x65;
    pcVar15 = (char *)&stack0xffffffffffffff08;
    pTVar14 = (Tree *)0x1f;
    auVar5 = ZEXT1224(ZEXT412(0x662e) << 0x40);
    LVar7.name.str._0_4_ = 0x1fdf9a;
    LVar7.super_LineCol.offset = auVar5._0_8_;
    LVar7.super_LineCol.line = auVar5._8_8_;
    LVar7.super_LineCol.col = auVar5._16_8_;
    LVar7.name.str._4_4_ = 0;
    LVar7.name.len = 0x65;
    (*(this->m_callbacks).m_error)(pcVar15,0x1f,LVar7,(this->m_callbacks).m_user_data);
  }
  if (src_node == 0xffffffffffffffff) {
    pcVar15 = (char *)src;
    src_node = root_id(src);
  }
  if (dst_node == 0xffffffffffffffff) {
    pcVar15 = (char *)this;
    dst_node = root_id(this);
  }
  if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
    if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_f8 = (NodeData *)0x0;
    uStack_f0 = 0x4b86;
    uStack_ec = 0;
    uStack_e8 = 0;
    uStack_e4 = 0;
    uStack_e0 = 0x1fdf9a;
    uStack_dc = 0;
    local_d8 = 0x65;
    pcVar15 = "check failed: i != NONE && i >= 0 && i < m_cap";
    pTVar14 = (Tree *)0x2e;
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((src->m_buf[src_node].m_type.type & VAL) == NOTYPE) {
    if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
      if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_f8 = (NodeData *)0x0;
      uStack_f0 = 0x4b86;
      uStack_ec = 0;
      uStack_e8 = 0;
      uStack_e4 = 0;
      uStack_e0 = 0x1fdf9a;
      uStack_dc = 0;
      local_d8 = 0x65;
      pcVar15 = "check failed: i != NONE && i >= 0 && i < m_cap";
      pTVar14 = (Tree *)0x2e;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((src->m_buf[src_node].m_type.type & SEQ) == NOTYPE) {
      if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
        if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_f8 = (NodeData *)0x0;
        uStack_f0 = 0x4b86;
        uStack_ec = 0;
        uStack_e8 = 0;
        uStack_e4 = 0;
        uStack_e0 = 0x1fdf9a;
        uStack_dc = 0;
        local_d8 = 0x65;
        pcVar15 = "check failed: i != NONE && i >= 0 && i < m_cap";
        pTVar14 = (Tree *)0x2e;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((src->m_buf[src_node].m_type.type & MAP) == NOTYPE) {
        pcVar15 = 
        "check failed: (src->has_val(src_node) || src->is_seq(src_node) || src->is_map(src_node))";
        puVar16 = &stack0xffffffffffffff08;
        for (lVar13 = 0xb; lVar13 != 0; lVar13 = lVar13 + -1) {
          *puVar16 = *(undefined8 *)pcVar15;
          pcVar15 = pcVar15 + ((ulong)bVar17 * -2 + 1) * 8;
          puVar16 = puVar16 + (ulong)bVar17 * -2 + 1;
        }
        local_a0 = 0;
        if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_80 = 0;
        sStack_78 = 0x6633;
        local_70 = (char *)0x0;
        pcStack_68 = 
        "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
        ;
        local_60 = (char *)0x65;
        sVar10 = 0x65;
        pcVar15 = (char *)&stack0xffffffffffffff08;
        pTVar14 = (Tree *)0x59;
        auVar5 = ZEXT1224(ZEXT412(0x6633) << 0x40);
        LVar8.name.str._0_4_ = 0x1fdf9a;
        LVar8.super_LineCol.offset = auVar5._0_8_;
        LVar8.super_LineCol.line = auVar5._8_8_;
        LVar8.super_LineCol.col = auVar5._16_8_;
        LVar8.name.str._4_4_ = 0;
        LVar8.name.len = 0x65;
        (*(this->m_callbacks).m_error)(pcVar15,0x59,LVar8,(this->m_callbacks).m_user_data);
      }
    }
  }
  if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
    if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
      pcVar3 = (code *)swi(3);
      (*pcVar3)();
      return;
    }
    local_f8 = (NodeData *)0x0;
    uStack_f0 = 0x4b86;
    uStack_ec = 0;
    uStack_e8 = 0;
    uStack_e4 = 0;
    uStack_e0 = 0x1fdf9a;
    uStack_dc = 0;
    local_d8 = 0x65;
    pcVar15 = "check failed: i != NONE && i >= 0 && i < m_cap";
    pTVar14 = (Tree *)0x2e;
    (*(code *)PTR_error_impl_00240518)
              ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
               (anonymous_namespace)::s_default_callbacks);
  }
  if ((src->m_buf[src_node].m_type.type & VAL) == NOTYPE) {
    if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
      if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_f8 = (NodeData *)0x0;
      uStack_f0 = 0x4b86;
      uStack_ec = 0;
      uStack_e8 = 0;
      uStack_e4 = 0;
      uStack_e0 = 0x1fdf9a;
      uStack_dc = 0;
      local_d8 = 0x65;
      pcVar15 = "check failed: i != NONE && i >= 0 && i < m_cap";
      pTVar14 = (Tree *)0x2e;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((src->m_buf[src_node].m_type.type & SEQ) == NOTYPE) {
      if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
        if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_f8 = (NodeData *)0x0;
        uStack_f0 = 0x4b86;
        uStack_ec = 0;
        uStack_e8 = 0;
        uStack_e4 = 0;
        uStack_e0 = 0x1fdf9a;
        uStack_dc = 0;
        local_d8 = 0x65;
        pcVar15 = "check failed: i != NONE && i >= 0 && i < m_cap";
        pTVar14 = (Tree *)0x2e;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((src->m_buf[src_node].m_type.type & MAP) == NOTYPE) {
        merge_with();
LAB_001c52f2:
        merge_with();
        pTStack_158 = src;
        uStack_150 = src_node;
        lStack_148 = src_node * 0x90;
        pTStack_140 = this;
        pTStack_138 = (Tree *)dst_node;
        bVar9 = has_children((Tree *)pcVar15,(size_t)pTVar14);
        if (bVar9) {
          builtin_strncpy(acStack_1f0,"check failed: (! has_children(node))",0x25);
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          uStack_180 = 0;
          uStack_178 = 0x67ea;
          uStack_170 = 0;
          pcStack_168 = 
          "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
          ;
          uStack_160 = 0x65;
          auVar5 = ZEXT1224(ZEXT412(0x67ea) << 0x40);
          LVar4.name.str._0_4_ = 0x1fdf9a;
          LVar4.super_LineCol.offset = auVar5._0_8_;
          LVar4.super_LineCol.line = auVar5._8_8_;
          LVar4.super_LineCol.col = auVar5._16_8_;
          LVar4.name.str._4_4_ = 0;
          LVar4.name.len = 0x65;
          (*(((Tree *)pcVar15)->m_callbacks).m_error)
                    (acStack_1f0,0x25,LVar4,(((Tree *)pcVar15)->m_callbacks).m_user_data);
        }
        sVar12 = parent((Tree *)pcVar15,(size_t)pTVar14);
        if (sVar12 != 0xffffffffffffffff) {
          bVar9 = has_parent((Tree *)pcVar15,(size_t)pTVar14);
          if (!bVar9) {
            if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            acStack_1f0[0] = '\0';
            acStack_1f0[1] = '\0';
            acStack_1f0[2] = '\0';
            acStack_1f0[3] = '\0';
            acStack_1f0[4] = '\0';
            acStack_1f0[5] = '\0';
            acStack_1f0[6] = '\0';
            acStack_1f0[7] = '\0';
            acStack_1f0[8] = -0x15;
            acStack_1f0[9] = 'K';
            acStack_1f0[10] = '\0';
            acStack_1f0[0xb] = '\0';
            acStack_1f0[0xc] = '\0';
            acStack_1f0[0xd] = '\0';
            acStack_1f0[0xe] = '\0';
            acStack_1f0[0xf] = '\0';
            acStack_1f0[0x10] = '\0';
            acStack_1f0[0x11] = '\0';
            acStack_1f0[0x12] = '\0';
            acStack_1f0[0x13] = '\0';
            acStack_1f0[0x14] = '\0';
            acStack_1f0[0x15] = '\0';
            acStack_1f0[0x16] = '\0';
            acStack_1f0[0x17] = '\0';
            acStack_1f0[0x18] = -0x66;
            acStack_1f0[0x19] = -0x21;
            acStack_1f0[0x1a] = '\x1f';
            acStack_1f0[0x1b] = '\0';
            acStack_1f0[0x1c] = '\0';
            acStack_1f0[0x1d] = '\0';
            acStack_1f0[0x1e] = '\0';
            acStack_1f0[0x1f] = '\0';
            acStack_1f0[0x20] = 'e';
            acStack_1f0[0x21] = '\0';
            acStack_1f0[0x22] = '\0';
            acStack_1f0[0x23] = '\0';
            acStack_1f0[0x24] = '\0';
            acStack_1f0[0x25] = '\0';
            acStack_1f0[0x26] = '\0';
            acStack_1f0[0x27] = '\0';
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: has_parent(node)",0x1e,
                       (anonymous_namespace)::s_default_callbacks);
          }
          if ((pTVar14 == (Tree *)0xffffffffffffffff) ||
             ((Tree *)((Tree *)pcVar15)->m_cap <= pTVar14)) {
            if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            acStack_1f0[0] = '\0';
            acStack_1f0[1] = '\0';
            acStack_1f0[2] = '\0';
            acStack_1f0[3] = '\0';
            acStack_1f0[4] = '\0';
            acStack_1f0[5] = '\0';
            acStack_1f0[6] = '\0';
            acStack_1f0[7] = '\0';
            acStack_1f0[8] = -0x7a;
            acStack_1f0[9] = 'K';
            acStack_1f0[10] = '\0';
            acStack_1f0[0xb] = '\0';
            acStack_1f0[0xc] = '\0';
            acStack_1f0[0xd] = '\0';
            acStack_1f0[0xe] = '\0';
            acStack_1f0[0xf] = '\0';
            acStack_1f0[0x10] = '\0';
            acStack_1f0[0x11] = '\0';
            acStack_1f0[0x12] = '\0';
            acStack_1f0[0x13] = '\0';
            acStack_1f0[0x14] = '\0';
            acStack_1f0[0x15] = '\0';
            acStack_1f0[0x16] = '\0';
            acStack_1f0[0x17] = '\0';
            acStack_1f0[0x18] = -0x66;
            acStack_1f0[0x19] = -0x21;
            acStack_1f0[0x1a] = '\x1f';
            acStack_1f0[0x1b] = '\0';
            acStack_1f0[0x1c] = '\0';
            acStack_1f0[0x1d] = '\0';
            acStack_1f0[0x1e] = '\0';
            acStack_1f0[0x1f] = '\0';
            acStack_1f0[0x20] = 'e';
            acStack_1f0[0x21] = '\0';
            acStack_1f0[0x22] = '\0';
            acStack_1f0[0x23] = '\0';
            acStack_1f0[0x24] = '\0';
            acStack_1f0[0x25] = '\0';
            acStack_1f0[0x26] = '\0';
            acStack_1f0[0x27] = '\0';
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
          }
          uVar1 = ((Tree *)pcVar15)->m_buf[(long)pTVar14].m_parent;
          if ((uVar1 == 0xffffffffffffffff) || (((Tree *)pcVar15)->m_cap <= uVar1)) {
            if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            acStack_1f0[0] = '\0';
            acStack_1f0[1] = '\0';
            acStack_1f0[2] = '\0';
            acStack_1f0[3] = '\0';
            acStack_1f0[4] = '\0';
            acStack_1f0[5] = '\0';
            acStack_1f0[6] = '\0';
            acStack_1f0[7] = '\0';
            acStack_1f0[8] = -0x7a;
            acStack_1f0[9] = 'K';
            acStack_1f0[10] = '\0';
            acStack_1f0[0xb] = '\0';
            acStack_1f0[0xc] = '\0';
            acStack_1f0[0xd] = '\0';
            acStack_1f0[0xe] = '\0';
            acStack_1f0[0xf] = '\0';
            acStack_1f0[0x10] = '\0';
            acStack_1f0[0x11] = '\0';
            acStack_1f0[0x12] = '\0';
            acStack_1f0[0x13] = '\0';
            acStack_1f0[0x14] = '\0';
            acStack_1f0[0x15] = '\0';
            acStack_1f0[0x16] = '\0';
            acStack_1f0[0x17] = '\0';
            acStack_1f0[0x18] = -0x66;
            acStack_1f0[0x19] = -0x21;
            acStack_1f0[0x1a] = '\x1f';
            acStack_1f0[0x1b] = '\0';
            acStack_1f0[0x1c] = '\0';
            acStack_1f0[0x1d] = '\0';
            acStack_1f0[0x1e] = '\0';
            acStack_1f0[0x1f] = '\0';
            acStack_1f0[0x20] = 'e';
            acStack_1f0[0x21] = '\0';
            acStack_1f0[0x22] = '\0';
            acStack_1f0[0x23] = '\0';
            acStack_1f0[0x24] = '\0';
            acStack_1f0[0x25] = '\0';
            acStack_1f0[0x26] = '\0';
            acStack_1f0[0x27] = '\0';
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
          }
          if ((((Tree *)pcVar15)->m_buf[uVar1].m_type.type & MAP) == NOTYPE) {
            builtin_strncpy(acStack_1f0 + 0x30,"_map(node))",0xc);
            builtin_strncpy(acStack_1f0 + 0x20,"ONE || parent_is",0x10);
            builtin_strncpy(acStack_1f0 + 0x10,"arent(node) == N",0x10);
            builtin_strncpy(acStack_1f0,"check failed: (p",0x10);
            if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            uStack_1a8 = 0;
            uStack_1a0 = 0x67eb;
            uStack_198 = 0;
            pcStack_190 = 
            "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
            ;
            uStack_188 = 0x65;
            auVar5 = ZEXT1224(ZEXT412(0x67eb) << 0x40);
            LVar6.name.str._0_4_ = 0x1fdf9a;
            LVar6.super_LineCol.offset = auVar5._0_8_;
            LVar6.super_LineCol.line = auVar5._8_8_;
            LVar6.super_LineCol.col = auVar5._16_8_;
            LVar6.name.str._4_4_ = 0;
            LVar6.name.len = 0x65;
            (*(((Tree *)pcVar15)->m_callbacks).m_error)
                      (acStack_1f0,0x3c,LVar6,(((Tree *)pcVar15)->m_callbacks).m_user_data);
          }
        }
        _check_next_flags((Tree *)pcVar15,(size_t)pTVar14,in_R8 | KEYSEQ);
        if ((pTVar14 == (Tree *)0xffffffffffffffff) || ((Tree *)((Tree *)pcVar15)->m_cap <= pTVar14)
           ) {
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          acStack_1f0[0] = '\0';
          acStack_1f0[1] = '\0';
          acStack_1f0[2] = '\0';
          acStack_1f0[3] = '\0';
          acStack_1f0[4] = '\0';
          acStack_1f0[5] = '\0';
          acStack_1f0[6] = '\0';
          acStack_1f0[7] = '\0';
          acStack_1f0[8] = -0x7d;
          acStack_1f0[9] = 'K';
          acStack_1f0[10] = '\0';
          acStack_1f0[0xb] = '\0';
          acStack_1f0[0xc] = '\0';
          acStack_1f0[0xd] = '\0';
          acStack_1f0[0xe] = '\0';
          acStack_1f0[0xf] = '\0';
          acStack_1f0[0x10] = '\0';
          acStack_1f0[0x11] = '\0';
          acStack_1f0[0x12] = '\0';
          acStack_1f0[0x13] = '\0';
          acStack_1f0[0x14] = '\0';
          acStack_1f0[0x15] = '\0';
          acStack_1f0[0x16] = '\0';
          acStack_1f0[0x17] = '\0';
          acStack_1f0[0x18] = -0x66;
          acStack_1f0[0x19] = -0x21;
          acStack_1f0[0x1a] = '\x1f';
          acStack_1f0[0x1b] = '\0';
          acStack_1f0[0x1c] = '\0';
          acStack_1f0[0x1d] = '\0';
          acStack_1f0[0x1e] = '\0';
          acStack_1f0[0x1f] = '\0';
          acStack_1f0[0x20] = 'e';
          acStack_1f0[0x21] = '\0';
          acStack_1f0[0x22] = '\0';
          acStack_1f0[0x23] = '\0';
          acStack_1f0[0x24] = '\0';
          acStack_1f0[0x25] = '\0';
          acStack_1f0[0x26] = '\0';
          acStack_1f0[0x27] = '\0';
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        ((Tree *)pcVar15)->m_buf[(long)pTVar14].m_type.type = in_R8 | KEYSEQ;
        if ((pTVar14 == (Tree *)0xffffffffffffffff) || ((Tree *)((Tree *)pcVar15)->m_cap <= pTVar14)
           ) {
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          acStack_1f0[0] = '\0';
          acStack_1f0[1] = '\0';
          acStack_1f0[2] = '\0';
          acStack_1f0[3] = '\0';
          acStack_1f0[4] = '\0';
          acStack_1f0[5] = '\0';
          acStack_1f0[6] = '\0';
          acStack_1f0[7] = '\0';
          acStack_1f0[8] = -0x7d;
          acStack_1f0[9] = 'K';
          acStack_1f0[10] = '\0';
          acStack_1f0[0xb] = '\0';
          acStack_1f0[0xc] = '\0';
          acStack_1f0[0xd] = '\0';
          acStack_1f0[0xe] = '\0';
          acStack_1f0[0xf] = '\0';
          acStack_1f0[0x10] = '\0';
          acStack_1f0[0x11] = '\0';
          acStack_1f0[0x12] = '\0';
          acStack_1f0[0x13] = '\0';
          acStack_1f0[0x14] = '\0';
          acStack_1f0[0x15] = '\0';
          acStack_1f0[0x16] = '\0';
          acStack_1f0[0x17] = '\0';
          acStack_1f0[0x18] = -0x66;
          acStack_1f0[0x19] = -0x21;
          acStack_1f0[0x1a] = '\x1f';
          acStack_1f0[0x1b] = '\0';
          acStack_1f0[0x1c] = '\0';
          acStack_1f0[0x1d] = '\0';
          acStack_1f0[0x1e] = '\0';
          acStack_1f0[0x1f] = '\0';
          acStack_1f0[0x20] = 'e';
          acStack_1f0[0x21] = '\0';
          acStack_1f0[0x22] = '\0';
          acStack_1f0[0x23] = '\0';
          acStack_1f0[0x24] = '\0';
          acStack_1f0[0x25] = '\0';
          acStack_1f0[0x26] = '\0';
          acStack_1f0[0x27] = '\0';
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar2 = ((Tree *)pcVar15)->m_buf;
        pNVar2[(long)pTVar14].m_key.tag.str = (char *)0x0;
        pNVar2[(long)pTVar14].m_key.tag.len = 0;
        pNVar2[(long)pTVar14].m_key.scalar.str = extraout_RDX;
        pNVar2[(long)pTVar14].m_key.scalar.len = sVar10;
        pcVar11 = &pNVar2[(long)pTVar14].m_key.anchor;
        pcVar11->str = (char *)0x0;
        pcVar11->len = 0;
        if ((pTVar14 == (Tree *)0xffffffffffffffff) || ((Tree *)((Tree *)pcVar15)->m_cap <= pTVar14)
           ) {
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          acStack_1f0[0] = '\0';
          acStack_1f0[1] = '\0';
          acStack_1f0[2] = '\0';
          acStack_1f0[3] = '\0';
          acStack_1f0[4] = '\0';
          acStack_1f0[5] = '\0';
          acStack_1f0[6] = '\0';
          acStack_1f0[7] = '\0';
          acStack_1f0[8] = -0x7d;
          acStack_1f0[9] = 'K';
          acStack_1f0[10] = '\0';
          acStack_1f0[0xb] = '\0';
          acStack_1f0[0xc] = '\0';
          acStack_1f0[0xd] = '\0';
          acStack_1f0[0xe] = '\0';
          acStack_1f0[0xf] = '\0';
          acStack_1f0[0x10] = '\0';
          acStack_1f0[0x11] = '\0';
          acStack_1f0[0x12] = '\0';
          acStack_1f0[0x13] = '\0';
          acStack_1f0[0x14] = '\0';
          acStack_1f0[0x15] = '\0';
          acStack_1f0[0x16] = '\0';
          acStack_1f0[0x17] = '\0';
          acStack_1f0[0x18] = -0x66;
          acStack_1f0[0x19] = -0x21;
          acStack_1f0[0x1a] = '\x1f';
          acStack_1f0[0x1b] = '\0';
          acStack_1f0[0x1c] = '\0';
          acStack_1f0[0x1d] = '\0';
          acStack_1f0[0x1e] = '\0';
          acStack_1f0[0x1f] = '\0';
          acStack_1f0[0x20] = 'e';
          acStack_1f0[0x21] = '\0';
          acStack_1f0[0x22] = '\0';
          acStack_1f0[0x23] = '\0';
          acStack_1f0[0x24] = '\0';
          acStack_1f0[0x25] = '\0';
          acStack_1f0[0x26] = '\0';
          acStack_1f0[0x27] = '\0';
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        pNVar2 = ((Tree *)pcVar15)->m_buf;
        pcVar11 = &pNVar2[(long)pTVar14].m_val.anchor;
        pcVar11->str = (char *)0x0;
        pcVar11->len = 0;
        pcVar11 = &pNVar2[(long)pTVar14].m_val.scalar;
        pcVar11->str = (char *)0x0;
        pcVar11->len = 0;
        pNVar2[(long)pTVar14].m_val.tag.str = (char *)0x0;
        pNVar2[(long)pTVar14].m_val.tag.len = 0;
        return;
      }
      if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
        if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_f8 = (NodeData *)0x0;
        uStack_f0 = 0x4b86;
        uStack_ec = 0;
        uStack_e8 = 0;
        uStack_e4 = 0;
        uStack_e0 = 0x1fdf9a;
        uStack_dc = 0;
        local_d8 = 0x65;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((this->m_buf[dst_node].m_type.type & MAP) == NOTYPE) {
        bVar9 = has_children(this,dst_node);
        if (bVar9) {
          remove_children(this,dst_node);
        }
        if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b83;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fdf9a;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        this->m_buf[dst_node].m_type.type = NOTYPE;
        if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b86;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fdf9a;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if ((src->m_buf[src_node].m_type.type & KEY) == NOTYPE) {
          to_map(this,dst_node,0);
        }
        else {
          pcVar11 = key(src,src_node);
          to_map(this,dst_node,*pcVar11,0);
        }
      }
      local_90 = dst_node * 0x90;
      for (sVar10 = first_child(src,src_node); sVar10 != 0xffffffffffffffff;
          sVar10 = next_sibling(src,sVar10)) {
        pcVar11 = key(src,sVar10);
        ichild = find_child(this,dst_node,pcVar11);
        sVar12 = local_90;
        if (ichild == 0xffffffffffffffff) {
          if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node))
          {
            if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4b83;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fdf9a;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
          }
          uVar1 = *(ulong *)((long)&this->m_buf->m_last_child + sVar12);
          if ((Tree *)dst_node == (Tree *)0xffffffffffffffff) {
            if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4cb1;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fdf9a;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: parent != NONE",0x1c,
                       (anonymous_namespace)::s_default_callbacks);
          }
          if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node))
          {
            if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4b86;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fdf9a;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
          }
          if (((*(byte *)((long)&(this->m_buf->m_type).type + sVar12) & 0x2c) == 0) &&
             (bVar9 = is_root(this,dst_node), !bVar9)) {
            if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4cb2;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fdf9a;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: is_container(parent) || is_root(parent)",0x35,
                       (anonymous_namespace)::s_default_callbacks);
          }
          if (uVar1 != 0xffffffffffffffff) {
            if (this->m_cap <= uVar1) {
              if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              local_f8 = (NodeData *)0x0;
              uStack_f0 = 0x4b83;
              uStack_ec = 0;
              uStack_e8 = 0;
              uStack_e4 = 0;
              uStack_e0 = 0x1fdf9a;
              uStack_dc = 0;
              local_d8 = 0x65;
              (*(code *)PTR_error_impl_00240518)
                        ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                         (anonymous_namespace)::s_default_callbacks);
            }
            if ((Tree *)this->m_buf[uVar1].m_parent != (Tree *)dst_node) {
              if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
                pcVar3 = (code *)swi(3);
                (*pcVar3)();
                return;
              }
              local_f8 = (NodeData *)0x0;
              uStack_f0 = 0x4cb3;
              uStack_ec = 0;
              uStack_e8 = 0;
              uStack_e4 = 0;
              uStack_e0 = 0x1fdf9a;
              uStack_dc = 0;
              local_d8 = 0x65;
              (*(code *)PTR_error_impl_00240518)
                        ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                         (anonymous_namespace)::s_default_callbacks);
            }
          }
          ichild = _claim(this);
          _set_hierarchy(this,ichild,dst_node,uVar1);
          _copy_props(this,ichild,src,sVar10);
        }
        merge_with(this,src,sVar10,ichild);
      }
    }
    else {
      if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
        if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_f8 = (NodeData *)0x0;
        uStack_f0 = 0x4b86;
        uStack_ec = 0;
        uStack_e8 = 0;
        uStack_e4 = 0;
        uStack_e0 = 0x1fdf9a;
        uStack_dc = 0;
        local_d8 = 0x65;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((this->m_buf[dst_node].m_type.type & SEQ) == NOTYPE) {
        bVar9 = has_children(this,dst_node);
        if (bVar9) {
          remove_children(this,dst_node);
        }
        if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b83;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fdf9a;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        this->m_buf[dst_node].m_type.type = NOTYPE;
        if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b86;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fdf9a;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if ((src->m_buf[src_node].m_type.type & KEY) == NOTYPE) {
          to_seq(this,dst_node,0);
        }
        else {
          pcVar11 = key(src,src_node);
          to_seq(this,dst_node,*pcVar11,0);
        }
      }
      sVar10 = first_child(src,src_node);
      local_88 = src;
      for (; sVar10 != 0xffffffffffffffff; sVar10 = next_sibling(pTVar14,sVar10)) {
        if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b83;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fdf9a;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        uVar1 = this->m_buf[dst_node].m_last_child;
        if ((Tree *)dst_node == (Tree *)0xffffffffffffffff) {
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4cb1;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fdf9a;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: parent != NONE",0x1c,(anonymous_namespace)::s_default_callbacks)
          ;
        }
        if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4b86;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fdf9a;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if (((this->m_buf[dst_node].m_type.type & (STREAM|MAP)) == NOTYPE) &&
           (bVar9 = is_root(this,dst_node), !bVar9)) {
          if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          local_f8 = (NodeData *)0x0;
          uStack_f0 = 0x4cb2;
          uStack_ec = 0;
          uStack_e8 = 0;
          uStack_e4 = 0;
          uStack_e0 = 0x1fdf9a;
          uStack_dc = 0;
          local_d8 = 0x65;
          (*(code *)PTR_error_impl_00240518)
                    ("check failed: is_container(parent) || is_root(parent)",0x35,
                     (anonymous_namespace)::s_default_callbacks);
        }
        if (uVar1 != 0xffffffffffffffff) {
          if (this->m_cap <= uVar1) {
            if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4b83;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fdf9a;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                       (anonymous_namespace)::s_default_callbacks);
          }
          if ((Tree *)this->m_buf[uVar1].m_parent != (Tree *)dst_node) {
            if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            local_f8 = (NodeData *)0x0;
            uStack_f0 = 0x4cb3;
            uStack_ec = 0;
            uStack_e8 = 0;
            uStack_e4 = 0;
            uStack_e0 = 0x1fdf9a;
            uStack_dc = 0;
            local_d8 = 0x65;
            (*(code *)PTR_error_impl_00240518)
                      ("check failed: after == NONE || (_p(after)->m_parent == parent)",0x3e,
                       (anonymous_namespace)::s_default_callbacks);
          }
        }
        sVar12 = _claim(this);
        _set_hierarchy(this,sVar12,dst_node,uVar1);
        pTVar14 = local_88;
        _copy_props_wo_key(this,sVar12,local_88,sVar10);
        merge_with(this,pTVar14,sVar10,sVar12);
      }
    }
  }
  else {
    if (((Tree *)dst_node == (Tree *)0xffffffffffffffff) || ((Tree *)this->m_cap <= dst_node)) {
      if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_f8 = (NodeData *)0x0;
      uStack_f0 = 0x4b86;
      uStack_ec = 0;
      uStack_e8 = 0;
      uStack_e4 = 0;
      uStack_e0 = 0x1fdf9a;
      uStack_dc = 0;
      local_d8 = 0x65;
      pcVar15 = "check failed: i != NONE && i >= 0 && i < m_cap";
      pTVar14 = (Tree *)0x2e;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    sVar10 = dst_node * 0x90;
    if (((this->m_buf[dst_node].m_type.type & VAL) == NOTYPE) &&
       (pTVar14 = (Tree *)dst_node, pcVar15 = (char *)this, bVar9 = has_children(this,dst_node),
       bVar9)) {
      pTVar14 = (Tree *)dst_node;
      pcVar15 = (char *)this;
      remove_children(this,dst_node);
    }
    if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
      if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
      local_f8 = (NodeData *)0x0;
      uStack_f0 = 0x4b86;
      uStack_ec = 0;
      uStack_e8 = 0;
      uStack_e4 = 0;
      uStack_e0 = 0x1fdf9a;
      uStack_dc = 0;
      local_d8 = 0x65;
      pcVar15 = "check failed: i != NONE && i >= 0 && i < m_cap";
      pTVar14 = (Tree *)0x2e;
      (*(code *)PTR_error_impl_00240518)
                ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                 (anonymous_namespace)::s_default_callbacks);
    }
    if ((~(int)src->m_buf[src_node].m_type.type & 3U) == 0) {
      _copy_props(this,dst_node,src,src_node);
    }
    else {
      if ((src_node == 0xffffffffffffffff) || (src->m_cap <= src_node)) {
        if (((s_error_flags & 1) != 0) && (bVar9 = is_debugger_attached(), bVar9)) {
          pcVar3 = (code *)swi(3);
          (*pcVar3)();
          return;
        }
        local_f8 = (NodeData *)0x0;
        uStack_f0 = 0x4b86;
        uStack_ec = 0;
        uStack_e8 = 0;
        uStack_e4 = 0;
        uStack_e0 = 0x1fdf9a;
        uStack_dc = 0;
        local_d8 = 0x65;
        pcVar15 = "check failed: i != NONE && i >= 0 && i < m_cap";
        pTVar14 = (Tree *)0x2e;
        (*(code *)PTR_error_impl_00240518)
                  ("check failed: i != NONE && i >= 0 && i < m_cap",0x2e,
                   (anonymous_namespace)::s_default_callbacks);
      }
      if ((src->m_buf[src_node].m_type.type & KEYVAL) != VAL) goto LAB_001c52f2;
      _copy_props_wo_key(this,dst_node,src,src_node);
    }
  }
  return;
}

Assistant:

void Tree::merge_with(Tree const *src, size_t src_node, size_t dst_node)
{
    _RYML_CB_ASSERT(m_callbacks, src != nullptr);
    if(src_node == NONE)
        src_node = src->root_id();
    if(dst_node == NONE)
        dst_node = root_id();
    _RYML_CB_ASSERT(m_callbacks, src->has_val(src_node) || src->is_seq(src_node) || src->is_map(src_node));

    if(src->has_val(src_node))
    {
        if( ! has_val(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
        }
        if(src->is_keyval(src_node))
            _copy_props(dst_node, src, src_node);
        else if(src->is_val(src_node))
            _copy_props_wo_key(dst_node, src, src_node);
        else
            C4_NEVER_REACH();
    }
    else if(src->is_seq(src_node))
    {
        if( ! is_seq(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
            _clear_type(dst_node);
            if(src->has_key(src_node))
                to_seq(dst_node, src->key(src_node));
            else
                to_seq(dst_node);
        }
        for(size_t sch = src->first_child(src_node); sch != NONE; sch = src->next_sibling(sch))
        {
            size_t dch = append_child(dst_node);
            _copy_props_wo_key(dch, src, sch);
            merge_with(src, sch, dch);
        }
    }
    else if(src->is_map(src_node))
    {
        if( ! is_map(dst_node))
        {
            if(has_children(dst_node))
                remove_children(dst_node);
            _clear_type(dst_node);
            if(src->has_key(src_node))
                to_map(dst_node, src->key(src_node));
            else
                to_map(dst_node);
        }
        for(size_t sch = src->first_child(src_node); sch != NONE; sch = src->next_sibling(sch))
        {
            size_t dch = find_child(dst_node, src->key(sch));
            if(dch == NONE)
            {
                dch = append_child(dst_node);
                _copy_props(dch, src, sch);
            }
            merge_with(src, sch, dch);
        }
    }
    else
    {
        C4_NEVER_REACH();
    }
}